

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p_test.cc
# Opt level: O2

bool is_valid(CameraPose *pose,
             vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *x,vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *X)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ResScalar RVar4;
  CameraPose *local_80;
  long local_78;
  Vector3d *local_70;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_60 [24];
  Vector3d z;
  
  uVar2 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar1 = ((long)(x->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(x->
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x18;
    uVar2 = uVar2 + 1;
    if (uVar1 <= uVar2) break;
    local_78 = (long)&(((X->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
               + lVar3;
    local_80 = pose;
    local_70 = &pose->t;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&z,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_80);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              ((PlainObject *)&local_80,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               ((long)&(((x->
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data + lVar3));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              ((PlainObject *)local_60,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&z);
    RVar4 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_80,local_60);
    lVar3 = lVar3 + 0x18;
  } while (ABS(1.0 - RVar4) <= 1e-08);
  return uVar1 <= uVar2;
}

Assistant:

bool is_valid(const CameraPose &pose, const std::vector<Eigen::Vector3d> &x, const std::vector<Eigen::Vector3d> &X) {
    for(int k = 0; k < x.size(); ++k) {
        Eigen::Vector3d z = pose.R * X[k] + pose.t;
        double res = std::abs(1 - x[k].normalized().dot(z.normalized()));
        if(res > 1e-8) {        
            return false;
        }
    }
    return true;
}